

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiFAQ.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<bool,_char> *ptVar5;
  typed_value<unsigned_long,_char> *ptVar6;
  size_type sVar7;
  ostream *poVar8;
  ostream *poVar9;
  any *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  Launcher *this;
  long lVar12;
  long lVar13;
  allocator local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  bool local_254;
  bool local_253;
  allocator local_252;
  allocator local_251;
  string outputDirectory;
  string codeGenerator;
  path pathToData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  path pathToFiles;
  string local_1a8;
  shared_ptr<Launcher> launcher;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_158 [144];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  options_description desc;
  
  std::__cxx11::string::string((string *)&vm,"multiFAQ - allowed options",(allocator *)&pathToData);
  boost::program_options::options_description::options_description
            (&desc,(string *)&vm,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&vm);
  local_278._M_dataplus._M_p = (pointer)boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_278,"help,h");
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar3,"info");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"path,p",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"files,f",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string((string *)&vm,"features.conf",(allocator *)&local_1a8);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&vm);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"feat",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string
            ((string *)&pathToData,"treedecomposition.conf",(allocator *)&launcher);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&pathToData.m_pathname);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"td",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string((string *)&pathToFiles,"schema.conf",&local_279);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&pathToFiles.m_pathname);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"schema",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string((string *)&codeGenerator,"covar",&local_251);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&codeGenerator);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"model,m",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"out,o",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string((string *)&outputDirectory,"both",&local_252);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&outputDirectory);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"parallel",(char *)ptVar4);
  ptVar5 = boost::program_options::value<bool>();
  local_253 = true;
  ptVar5 = boost::program_options::typed_value<bool,_char>::default_value(ptVar5,&local_253);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"mo",(char *)ptVar5);
  ptVar5 = boost::program_options::value<bool>();
  local_254 = true;
  ptVar5 = boost::program_options::typed_value<bool,_char>::default_value(ptVar5,&local_254);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"compress",(char *)ptVar5);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,"microbench");
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,"bench_individual");
  ptVar6 = boost::program_options::value<unsigned_long>();
  local_1e8._M_dataplus._M_p = (pointer)0x5;
  ptVar6 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar6,(unsigned_long *)&local_1e8);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"clusters,k",(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_long>();
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"kappa",(char *)ptVar6);
  std::__cxx11::string::~string((string *)&outputDirectory);
  std::__cxx11::string::~string((string *)&codeGenerator);
  std::__cxx11::string::~string((string *)&pathToFiles);
  std::__cxx11::string::~string((string *)&pathToData);
  std::__cxx11::string::~string((string *)&vm);
  boost::program_options::variables_map::variables_map(&vm);
  local_c8.super_function_base.vtable = (vtable_base *)0x0;
  local_c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_c8.super_function_base.functor._8_8_ = 0;
  local_c8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&pathToData,argc,argv,&desc,0,&local_c8);
  boost::program_options::store((basic_parsed_options *)&pathToData,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&pathToData);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_c8);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)&pathToData,"help",(allocator *)&pathToFiles);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_158,&pathToData.m_pathname);
  std::__cxx11::string::~string((string *)&pathToData);
  if (sVar7 == 0) {
    std::__cxx11::string::string((string *)&pathToData,"info",(allocator *)&pathToFiles);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_158,&pathToData.m_pathname);
    std::__cxx11::string::~string((string *)&pathToData);
    if (sVar7 == 0) {
      pathToData.m_pathname._M_dataplus._M_p = (pointer)&pathToData.m_pathname.field_2;
      pathToData.m_pathname._M_string_length = 0;
      pathToData.m_pathname.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&pathToFiles,"path",(allocator *)&codeGenerator);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_158,&pathToFiles.m_pathname);
      std::__cxx11::string::~string((string *)&pathToFiles);
      if (sVar7 == 0) {
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "You must specify a path containing the database and configuration files.\n"
                                );
        pcVar3 = "Run program with --help for more information about command line options.\n";
LAB_00141058:
        std::operator<<(poVar8,pcVar3);
        iVar2 = 1;
      }
      else {
        std::__cxx11::string::string((string *)&outputDirectory,"path",(allocator *)&local_1e8);
        paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar10);
        std::__cxx11::string::string((string *)&codeGenerator,(string *)pbVar11);
        boost::filesystem::current_path();
        boost::filesystem::canonical(&pathToFiles,(path *)&codeGenerator,(path *)&local_278);
        std::__cxx11::string::operator=((string *)&pathToData,(string *)&pathToFiles);
        std::__cxx11::string::~string((string *)&pathToFiles);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&codeGenerator);
        std::__cxx11::string::~string((string *)&outputDirectory);
        bVar1 = boost::filesystem::is_directory(&pathToData);
        if (!bVar1) {
          pcVar3 = "Provided path is not a directory. \n";
          poVar8 = (ostream *)&std::cerr;
          goto LAB_00141058;
        }
        pathToFiles.m_pathname._M_dataplus._M_p = (pointer)&pathToFiles.m_pathname.field_2;
        pathToFiles.m_pathname._M_string_length = 0;
        pathToFiles.m_pathname.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string((string *)&codeGenerator,"files",(allocator *)&outputDirectory)
        ;
        sVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_158,&codeGenerator);
        std::__cxx11::string::~string((string *)&codeGenerator);
        if (sVar7 == 0) {
          std::__cxx11::string::_M_assign((string *)&pathToFiles);
LAB_00141077:
          std::__cxx11::string::string((string *)&codeGenerator,"cpp",(allocator *)&outputDirectory)
          ;
          iVar2 = std::__cxx11::string::compare((char *)&codeGenerator);
          if (iVar2 == 0) {
LAB_00141110:
            outputDirectory._M_dataplus._M_p = (pointer)&outputDirectory.field_2;
            outputDirectory._M_string_length = 0;
            outputDirectory.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::string((string *)&local_278,"out",(allocator *)&local_1e8);
            sVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    ::count(local_158,&local_278);
            std::__cxx11::string::~string((string *)&local_278);
            if (sVar7 == 0) {
              std::operator+(&local_1e8,"runtime/",&codeGenerator);
              std::operator+(&local_278,&local_1e8,"/");
              std::__cxx11::string::operator=((string *)&outputDirectory,(string *)&local_278);
              std::__cxx11::string::~string((string *)&local_278);
              pbVar11 = &local_1e8;
            }
            else {
              std::__cxx11::string::string((string *)&launcher,"out",&local_279);
              paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]
                                         ((string *)&vm);
              pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar10);
              std::__cxx11::string::string((string *)&local_1a8,(string *)pbVar11);
              boost::filesystem::weakly_canonical((path *)&local_1e8,(path *)&local_1a8);
              std::operator+(&local_278,&local_1e8,"/");
              std::__cxx11::string::operator=((string *)&outputDirectory,(string *)&local_278);
              std::__cxx11::string::~string((string *)&local_278);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_1a8);
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &launcher;
            }
            std::__cxx11::string::~string((string *)pbVar11);
            std::__cxx11::string::string((string *)&local_278,(string *)&outputDirectory);
            boost::filesystem::create_directories((path *)&local_278);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::_M_assign((string *)multifaq::dir::PATH_TO_DATA_abi_cxx11_);
            boost::filesystem::path::filename();
            std::__cxx11::string::_M_assign((string *)multifaq::dir::DATASET_NAME_abi_cxx11_);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::_M_assign((string *)multifaq::dir::PATH_TO_FILES_abi_cxx11_);
            std::__cxx11::string::_M_assign((string *)multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
            this = (Launcher *)operator_new(0x90);
            Launcher::Launcher(this);
            std::__shared_ptr<Launcher,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Launcher,void>
                      ((__shared_ptr<Launcher,(__gnu_cxx::_Lock_policy)2> *)&launcher,this);
            lVar12 = std::chrono::_V2::system_clock::now();
            iVar2 = Launcher::launch(launcher.
                                     super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                     ,&vm);
            lVar13 = std::chrono::_V2::system_clock::now();
            std::__cxx11::to_string(&local_1a8,lVar12 / -1000000 + lVar13 / 1000000);
            std::operator+(&local_1e8,"BENCH - overall compilation time: ",&local_1a8);
            std::operator+(&local_278,&local_1e8,"ms.\n");
            std::operator<<((ostream *)&std::cout,(string *)&local_278);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1a8);
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "----------------------------------------");
            std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<((ostream *)&std::cout,"The generated code was output to: ");
            poVar8 = std::operator<<(poVar8,(string *)&outputDirectory);
            std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "Run the following commands to execute code: ");
            std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<((ostream *)&std::cout,"   cd ");
            poVar8 = std::operator<<(poVar8,(string *)&outputDirectory);
            std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<((ostream *)&std::cout,"   make -j ");
            std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<((ostream *)&std::cout,"   ./lmfao ");
            std::endl<char,std::char_traits<char>>(poVar8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&launcher.super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__cxx11::string::~string((string *)&outputDirectory);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&codeGenerator);
            if (iVar2 == 0) goto LAB_00141110;
            std::operator+(&local_278,"The code generator ",&codeGenerator);
            std::operator+(&outputDirectory,&local_278," is not supported. \n");
            std::operator<<((ostream *)&std::cerr,(string *)&outputDirectory);
            std::__cxx11::string::~string((string *)&outputDirectory);
            std::__cxx11::string::~string((string *)&local_278);
            iVar2 = 1;
          }
          std::__cxx11::string::~string((string *)&codeGenerator);
        }
        else {
          std::__cxx11::string::string((string *)&local_278,"files",(allocator *)&local_1a8);
          paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm)
          ;
          pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar10);
          std::__cxx11::string::string((string *)&outputDirectory,(string *)pbVar11);
          boost::filesystem::current_path();
          boost::filesystem::canonical
                    ((path *)&codeGenerator,(path *)&outputDirectory,(path *)&local_1e8);
          std::__cxx11::string::operator=((string *)&pathToFiles,(string *)&codeGenerator);
          std::__cxx11::string::~string((string *)&codeGenerator);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&outputDirectory);
          std::__cxx11::string::~string((string *)&local_278);
          bVar1 = boost::filesystem::is_directory(&pathToFiles);
          if (bVar1) goto LAB_00141077;
          std::operator<<((ostream *)&std::cerr,"Provided path to files is not a directory. \n");
          iVar2 = 1;
        }
        std::__cxx11::string::~string((string *)&pathToFiles);
      }
      std::__cxx11::string::~string((string *)&pathToData);
      goto LAB_00140de3;
    }
    std::operator<<((ostream *)&std::cout,"LMFAO - 0.1 Edition\n");
    poVar8 = (ostream *)&std::cout;
    poVar9 = std::operator<<((ostream *)&std::cout,"Compiled on ");
    poVar9 = std::operator<<(poVar9,"Apr 26 2025");
    poVar9 = std::operator<<(poVar9," at ");
    poVar9 = std::operator<<(poVar9,"23:13:05");
    std::operator<<(poVar9,".\n");
    pcVar3 = "Build type: Benchmark.\n";
  }
  else {
    poVar8 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
    pcVar3 = "\n";
  }
  iVar2 = 0;
  std::operator<<(poVar8,pcVar3);
LAB_00140de3:
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::options_description::~options_description(&desc);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
   /* Object containing a description of all the options available in the
      program. */
   boost::program_options::options_description desc("multiFAQ - allowed options");
   desc.add_options()
       /* Option to show help. */
       ("help,h", "produce help message.")
       /* Option to show some info. */
       ("info", "show some information about the program.")
       /* Option for path to data and configuration files. */
       ("path,p", boost::program_options::value<std::string>(),
        "set path for data and configuration files - required.")
       /* Option for path to data and configuration files. */
       ("files,f", boost::program_options::value<std::string>(),
        "set path for config files - if different from path to data.")     
       /* Option for feature config file. */
       ("feat", boost::program_options::value<std::string>()->
        default_value("features.conf"),
        "features file for this model, assumed to be in pathToFiles")
       /* Option for treedecomposition config file. */
       ("td", boost::program_options::value<std::string>()->
        default_value("treedecomposition.conf"),
        "tree decomposition config file, assumed to be in pathToFiles")
       /* Option for treedecomposition config file. */
       ("schema", boost::program_options::value<std::string>()->
        default_value("schema.conf"),
        "schmea config file, assumed to be in pathToFiles")
       /* Option for machine learning model. */
       ("model,m", boost::program_options::value<std::string>()->default_value("covar"),
        "model to be computed: reg, covar (default), ctree, rtree, cube, mi, or perc")
       /* Option for code generator. */
       // ("codegen,g", boost::program_options::value<std::string>()->default_value("cpp"),
       //  "open for code generation: cpp (default), or sql")
       /* Option for directory of generated code. */
       ("out,o",boost::program_options::value<std::string>(),
        "output directory for the generated code, default: runtime/cpp/")
       /* Option for parallellization. */
       ("parallel", boost::program_options::value<std::string>()->default_value("both"),
        "options for parallelization: none, task, domain, or both (default)")
       /* Option to turn off mutlti output operator. */
       ("mo", boost::program_options::value<bool>()->default_value("1"),
        "turn multioutput operator on (default)/off")
       /* Option to turn off compression of aggregates operator. */
       ("compress", boost::program_options::value<bool>()->default_value("1"),
        "turn compression of aggregates on (default)/off")
       /* Option to turn off mutlti output operator. */
       // ("resort", "enables resorting of views / relations, requires multiout off.")
       /* Option to turn off mutlti output operator. */
       ("microbench", "enables micro benchmarking.")
       /* Option to turn off mutlti output operator. */
       ("bench_individual", "enables benchmarking for each group individually.")
       ("clusters,k", boost::program_options::value<size_t>()->default_value(5),
        "k for k-means algorithm. (Default = 5).")
       ("kappa", boost::program_options::value<size_t>(),
        "kappa for k-means algorithm. (Default = k).");
       /* Option for parallellization. */
       // ("degree", boost::program_options::value<int>()->default_value(1),
       //  "Degree of interactions for regression models and FMs. (Default = 1).");


   /* Register previous options and do command line parsing. */
   boost::program_options::variables_map vm;
   boost::program_options::store(
       boost::program_options::parse_command_line(argc, argv, desc), vm);
   boost::program_options::notify(vm);

   /* Display help. */
   if (vm.count("help"))
   {
      std::cout << desc << "\n";
      return EXIT_SUCCESS;
   }

   /* Display info. */
   if (vm.count("info"))
   {
      std::cout << "LMFAO - 0.1 Edition\n";
      std::cout << "Compiled on " << __DATE__ << " at " << __TIME__ << ".\n";
#ifdef BENCH
      std::cout << "Build type: Benchmark.\n";
#elif defined NDEBUG
      std::cout << "Build type: Release.\n";
#else
      std::cout << "Build type: Debug.\n";
#endif
      return EXIT_SUCCESS;
   }

   
   boost::filesystem::path pathToData;
   
   /* Retrieve compulsory path. */
   if (vm.count("path"))
   {
       
       pathToData = boost::filesystem::canonical(vm["path"].as<std::string>());

       /*If provided path is not a directory, return failure. */
       if (!boost::filesystem::is_directory(pathToData))
       {
           ERROR("Provided path is not a directory. \n");
           return EXIT_FAILURE;
       }
   }
   else
   {
      ERROR(
         "You must specify a path containing the database and configuration files.\n" <<
         "Run program with --help for more information about command line options.\n");
      return EXIT_FAILURE;
   }   

   boost::filesystem::path pathToFiles;

   /* Retrieve path to files. */
   if (vm.count("files"))
   {
       pathToFiles = boost::filesystem::canonical(vm["files"].as<std::string>());

       /*If provided path is not a directory, return failure. */
       if (!boost::filesystem::is_directory(pathToFiles))
       {
           ERROR("Provided path to files is not a directory. \n");
           return EXIT_FAILURE;
       }
   }
   else
   {
       pathToFiles = pathToData;
   }   

   /* Check the code generator is supported */
   std::string codeGenerator =  "cpp"; // vm["codegen"].as<std::string>();

   if (codeGenerator.compare("cpp") != 0 && codeGenerator.compare("sql") != 0)
   {
       ERROR("The code generator "+codeGenerator+" is not supported. \n");
       return EXIT_FAILURE;
   }


   /* Set the path for outDirectory */
   std::string outputDirectory;
   if (vm.count("out"))
       outputDirectory = boost::filesystem::weakly_canonical(
           vm["out"].as<std::string>()).string()+"/";
   else
       outputDirectory = "runtime/"+codeGenerator+"/";
   
   /*If provided path is not a directory, create it. */
   if (boost::filesystem::create_directories(outputDirectory))
   {   
       DINFO("INFO: Output directory " << outputDirectory << " created." << std::endl);
   }
   else
   {    
       DINFO("INFO: Output directory " << outputDirectory << " exists." << std::endl);
   }
   
           
   /* Setting global parameters for directories */
   multifaq::dir::PATH_TO_DATA = pathToData.string();
   multifaq::dir::DATASET_NAME = pathToData.filename().string();
   multifaq::dir::PATH_TO_FILES = pathToFiles.string();
   multifaq::dir::OUTPUT_DIRECTORY = outputDirectory;


   /* Create and run Launcher */
   std::shared_ptr<Launcher> launcher(new Launcher());

#ifdef BENCH
   int64_t start = std::chrono::duration_cast<std::chrono::milliseconds>(
       std::chrono::system_clock::now().time_since_epoch()).count();
#endif

   /* Launch program. */
   int result = launcher->launch(vm);

#ifdef BENCH
   int64_t end = std::chrono::duration_cast<std::chrono::milliseconds>(
       std::chrono::system_clock::now().time_since_epoch()).count() - start;
#endif

   BINFO("BENCH - overall compilation time: " + std::to_string(end) + "ms.\n");
   DINFO("INFO: Completed execution \n");
   
   std::cout << "----------------------------------------" << std::endl;
   std::cout << "The generated code was output to: " << outputDirectory << std::endl;
   std::cout << "Run the following commands to execute code: "  << std::endl;
   std::cout << "   cd " << outputDirectory << std::endl;
   std::cout << "   make -j " << std::endl;
   std::cout << "   ./lmfao " << std::endl;
   
   return result;
}